

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void encode_b_nonrd(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **tp,
                   int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
                   PICK_MODE_CONTEXT *ctx,int *rate)

{
  EncQuantDequantParams *pEVar1;
  uint8_t ref_frame_type;
  int iVar2;
  AV1_COMP *in_RDX;
  long in_RSI;
  MACROBLOCK *in_RDI;
  AV1_COMP *unaff_retaddr;
  char in_stack_00000008;
  byte in_stack_00000010;
  int32_t blocks;
  int seg_ref_active;
  RD_COUNTS *rdc;
  int subsampling_y;
  int subsampling_x;
  MB_MODE_INFO *mbmi;
  int origin_mult;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TileInfo *tile;
  AV1_COMMON *cm;
  TokenExtra **in_stack_00000088;
  undefined6 in_stack_00000091;
  BLOCK_SIZE in_stack_00000097;
  undefined3 in_stack_00000099;
  int in_stack_0000009c;
  undefined7 in_stack_000000a1;
  RUN_TYPE in_stack_000000c0;
  MACROBLOCK *in_stack_ffffffffffffff80;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 uVar3;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff96;
  MV_REFERENCE_FRAME ref1;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff97;
  MV_REFERENCE_FRAME ref0;
  undefined8 in_stack_ffffffffffffff98;
  MACROBLOCKD *xd_00;
  int in_stack_ffffffffffffffa0;
  undefined4 uVar4;
  int in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  MACROBLOCK *in_stack_ffffffffffffffa8;
  MB_MODE_INFO *mbmi_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar6;
  TileInfo *tile_00;
  AV1_COMP *pAVar7;
  MACROBLOCK *x_00;
  
  uVar3 = (undefined2)((ulong)in_stack_ffffffffffffff98 >> 0x30);
  tile_00 = (TileInfo *)((in_RDX->enc_quant_dequant_params).quants.y_quant + 0x19);
  pAVar7 = in_RDX;
  x_00 = in_RDI;
  av1_set_offsets_without_segment_id
            (in_RDX,tile_00,
             (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
             (BLOCK_SIZE)((uint)in_stack_ffffffffffffffa4 >> 0x18));
  uVar6 = *(undefined4 *)((in_RDX->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4);
  setup_block_rdmult((AV1_COMP *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
                     ,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                     (BLOCK_SIZE)((ushort)uVar3 >> 8),(AQ_MODE)uVar3,(MB_MODE_INFO *)in_RDX);
  mbmi_00 = (MB_MODE_INFO *)**(long **)&tile_00[0x147].tile_row;
  mbmi_00->partition = (PARTITION_TYPE)blocks;
  av1_update_state((AV1_COMP *)rate,(ThreadData_conflict *)ctx,
                   (PICK_MODE_CONTEXT *)CONCAT71(in_stack_000000a1,partition),in_stack_0000009c,
                   _bsize,in_stack_00000097,in_stack_000000c0);
  uVar5 = *(undefined4 *)(*(long *)(x_00[1].comp_rd_stats[4].is_global + 1) + 0x60);
  uVar4 = *(undefined4 *)(*(long *)(x_00[1].comp_rd_stats[4].is_global + 1) + 100);
  if (in_stack_00000008 == '\0') {
    set_cb_offsets((uint16_t *)
                   (*(long *)((in_RDX->enc_quant_dequant_params).quants.y_quant_fp[0x16] + 4) + 0x4e
                   ),(in_RDX->enc_quant_dequant_params).quants.y_quant_fp[0x18][4],
                   (in_RDX->enc_quant_dequant_params).quants.y_quant_fp[0x18][5]);
  }
  encode_superblock((AV1_COMP *)CONCAT71(in_stack_000000a1,partition),
                    (TileDataEnc *)CONCAT44(in_stack_0000009c,_bsize),
                    (ThreadData_conflict *)
                    CONCAT17(in_stack_00000097,CONCAT61(in_stack_00000091,dry_run)),
                    in_stack_00000088,cpi._7_1_,cpi._6_1_,rate);
  if (in_stack_00000008 == '\0') {
    update_cb_offsets(in_stack_ffffffffffffff80,(BLOCK_SIZE)((ulong)_subsampling_y >> 0x38),
                      (int)_subsampling_y,0);
    iVar2 = has_second_ref(mbmi_00);
    if (iVar2 != 0) {
      if ((((byte)((ushort)*(undefined2 *)&mbmi_00->field_0xa7 >> 9) & 1) == 0) ||
         ((mbmi_00->interinter_comp).type == '\0')) {
        *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfeff;
      }
      else {
        *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfeff | 0x100;
      }
      *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfdff | 0x200;
    }
    xd_00 = (MACROBLOCKD *)((pAVar7->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0x13);
    if ((*(ushort *)&mbmi_00->field_0xa7 >> 6 & 1) == 0) {
      iVar2 = segfeature_active((segmentation *)(in_RDI[1].thresh_freq_fact[0xe] + 0x7f),
                                (byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7,'\x05');
      uVar3 = (undefined2)iVar2;
      ref1 = (MV_REFERENCE_FRAME)((uint)iVar2 >> 0x10);
      ref0 = (MV_REFERENCE_FRAME)((uint)iVar2 >> 0x18);
      if ((iVar2 == 0) &&
         (iVar2 = is_inter_block((MB_MODE_INFO *)in_stack_ffffffffffffff80), iVar2 != 0)) {
        av1_collect_neighbors_ref_counts
                  ((MACROBLOCKD *)
                   CONCAT17(ref0,CONCAT16(ref1,CONCAT24(uVar3,in_stack_ffffffffffffff90))));
        if ((*(char *)((long)in_RDI[1].picked_ref_frames_mask + 0x6d1) == '\x02') &&
           (iVar2 = has_second_ref(mbmi_00), iVar2 != 0)) {
          xd_00->mi_row = 1;
        }
        set_ref_ptrs((AV1_COMMON *)CONCAT44(uVar5,uVar4),xd_00,ref0,ref1);
      }
    }
    else {
      *(int *)((long)((pAVar7->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0x13) + 4) = 1;
      if ((*(char *)((long)in_RDI[1].picked_ref_frames_mask + 0x6d1) == '\x02') &&
         (iVar2 = has_second_ref(mbmi_00), iVar2 != 0)) {
        xd_00->mi_row = 1;
      }
      set_ref_ptrs((AV1_COMMON *)CONCAT44(uVar5,uVar4),xd_00,in_stack_ffffffffffffff97,
                   in_stack_ffffffffffffff96);
    }
    if ((*(int *)((long)x_00[1].comp_rd_stats[10].dist + 0x14) == 3) &&
       ((mbmi_00->mode == '\x10' || (mbmi_00->mode < 0xd)))) {
      *(uint *)xd_00->plane[0].seg_qmatrix[0] =
           (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [in_stack_00000010] *
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [in_stack_00000010] + *(int *)xd_00->plane[0].seg_qmatrix[0];
    }
    if (*(char *)(in_RSI + 0x5330) != '\0') {
      update_stats((AV1_COMMON *)CONCAT71(in_stack_000000a1,partition),
                   (ThreadData_conflict *)CONCAT44(in_stack_0000009c,_bsize));
    }
  }
  if (((((char)x_00[1].comp_rd_stats[0xb].dist[2] == '\x03') ||
       (*(int *)(x_00[3].e_mbd.plane[1].seg_iqmatrix[3] + 9) != 0)) && (mbmi_00->skip_txfm != '\0'))
     && ((x_00[2].sb_enc.tpl_mv[0x2b][1].as_int == 0 &&
         ((char)in_RDI[1].thresh_freq_fact[0xe][0x7f] != '\0')))) {
    av1_cyclic_reset_segment_skip
              (unaff_retaddr,x_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
               (BLOCK_SIZE)((ulong)pAVar7 >> 0x38),(RUN_TYPE)((ulong)pAVar7 >> 0x30));
  }
  mbmi_ext_best =
       *(MB_MODE_INFO_EXT_FRAME **)((in_RDX->enc_quant_dequant_params).quants.y_quant_fp[0x16] + 4);
  pEVar1 = &in_RDX->enc_quant_dequant_params;
  ref_frame_type = av1_ref_frame_type(_subsampling_y);
  av1_copy_mbmi_ext_to_mbmi_ext_frame
            (mbmi_ext_best,(MB_MODE_INFO_EXT *)((pEVar1->quants).y_round + 0xc6),ref_frame_type);
  *(undefined4 *)((in_RDX->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) = uVar6;
  return;
}

Assistant:

static void encode_b_nonrd(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                           ThreadData *td, TokenExtra **tp, int mi_row,
                           int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                           PARTITION_TYPE partition,
                           PICK_MODE_CONTEXT *const ctx, int *rate) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);
  const int subsampling_x = cpi->common.seq_params->subsampling_x;
  const int subsampling_y = cpi->common.seq_params->subsampling_y;
  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);
  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
      mbmi->compound_idx = 1;
    }
    RD_COUNTS *const rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
          has_second_ref(mbmi)) {
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
              has_second_ref(mbmi)) {
            // This flag is also updated for 4x4 blocks
            rdc->compound_ref_used_flag = 1;
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }
    if (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY &&
        (mbmi->mode == NEWMV || mbmi->mode < INTRA_MODE_END)) {
      int32_t blocks = mi_size_high[bsize] * mi_size_wide[bsize];
      rdc->newmv_or_intra_blocks += blocks;
    }
    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);
  }
  if ((cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ ||
       cpi->active_map.enabled) &&
      mbmi->skip_txfm && !cpi->rc.rtc_external_ratectrl && cm->seg.enabled)
    av1_cyclic_reset_segment_skip(cpi, x, mi_row, mi_col, bsize, dry_run);
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
}